

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

uint64_t aom_mse_wxh_16bit_c(uint8_t *dst,int dstride,uint16_t *src,int sstride,int w,int h)

{
  int e;
  int j;
  int i;
  uint64_t sum;
  int h_local;
  int w_local;
  int sstride_local;
  uint16_t *src_local;
  int dstride_local;
  uint8_t *dst_local;
  
  sum = 0;
  for (i = 0; i < h; i = i + 1) {
    for (j = 0; j < w; j = j + 1) {
      sum = (long)(int)(((uint)dst[i * dstride + j] - (uint)src[i * sstride + j]) *
                       ((uint)dst[i * dstride + j] - (uint)src[i * sstride + j])) + sum;
    }
  }
  return sum;
}

Assistant:

uint64_t aom_mse_wxh_16bit_c(uint8_t *dst, int dstride, uint16_t *src,
                             int sstride, int w, int h) {
  uint64_t sum = 0;
  for (int i = 0; i < h; i++) {
    for (int j = 0; j < w; j++) {
      int e = (uint16_t)dst[i * dstride + j] - src[i * sstride + j];
      sum += e * e;
    }
  }
  return sum;
}